

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nestl_test.hpp
# Opt level: O1

void nestl::test::detail::print_tuple_impl<char,std::char_traits<char>,std::tuple<char_const*>,0ul>
               (ostream *os,undefined8 *t)

{
  char *__s;
  size_t sVar1;
  
  __s = (char *)*t;
  if (__s != (char *)0x0) {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar1);
    return;
  }
  std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  return;
}

Assistant:

void print_tuple_impl(std::basic_ostream<Ch, Tr>& os, const Tuple& t, seq<Is...>)
{
    using swallow = int[1 + sizeof...(Is)];
    (void)swallow
    {
        0,
        (void(os << /* (Is == 0 ? "" : ", ") << */ std::get<Is>(t)), 0)...
    };
}